

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNegativePartialUpdateTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::egl::anon_unknown_0::NoAgeTest::iterate(NoAgeTest *this)

{
  deUint32 err;
  deBool dVar1;
  EGLBoolean got;
  Library *egl_00;
  TestLog *log_00;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  ScopedLogSection local_60 [3];
  EGLint aEStack_48 [2];
  EGLint damageRegion [4];
  CallLogWrapper wrapper;
  TestLog *log;
  Library *egl;
  NoAgeTest *this_local;
  
  egl_00 = EglTestContext::getLibrary
                     ((this->super_NegativePartialUpdateTest).super_TestCase.m_eglTestCtx);
  log_00 = tcu::TestContext::getLog
                     ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  eglu::CallLogWrapper::CallLogWrapper((CallLogWrapper *)(damageRegion + 2),egl_00,log_00);
  aEStack_48[0] = 10;
  aEStack_48[1] = 10;
  damageRegion[0] = 10;
  damageRegion[1] = 10;
  eglu::CallLogWrapper::enableLogging((CallLogWrapper *)(damageRegion + 2),true);
  tcu::TestContext::setTestResult
            ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"Test5",&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"If buffer age is not queried --> EGL_BAD_ACCESS",&local_a9);
  tcu::ScopedLogSection::ScopedLogSection(local_60,log_00,&local_80,&local_a8);
  tcu::ScopedLogSection::~ScopedLogSection(local_60);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  do {
    (*egl_00->_vptr_Library[0x30])
              (egl_00,(this->super_NegativePartialUpdateTest).m_eglDisplay,
               (this->super_NegativePartialUpdateTest).m_eglSurface,0x3093,0x3095);
    err = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(err,
                     "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                     ,0x1bc);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  got = eglu::CallLogWrapper::eglSetDamageRegionKHR
                  ((CallLogWrapper *)(damageRegion + 2),
                   (this->super_NegativePartialUpdateTest).m_eglDisplay,
                   (this->super_NegativePartialUpdateTest).m_eglSurface,aEStack_48,1);
  NegativePartialUpdateTest::expectFalse(&this->super_NegativePartialUpdateTest,got);
  NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x3002);
  eglu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)(damageRegion + 2));
  return STOP;
}

Assistant:

TestCase::IterateResult NoAgeTest::iterate (void)
{
	const Library&			egl				= m_eglTestCtx.getLibrary();
	TestLog&				log				= m_testCtx.getLog();
	CallLogWrapper			wrapper			(egl, log);
	EGLint					damageRegion[]	= { 10, 10, 10, 10 };

	wrapper.enableLogging(true);
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	{
		tcu::ScopedLogSection(log, "Test5", "If buffer age is not queried --> EGL_BAD_ACCESS");
		EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));
		expectFalse(wrapper.eglSetDamageRegionKHR(m_eglDisplay, m_eglSurface, damageRegion, DE_LENGTH_OF_ARRAY(damageRegion)/4));
		expectError(EGL_BAD_ACCESS);
	}

	return STOP;
}